

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_packing_pass.cpp
# Opt level: O0

uint32_t __thiscall
spvtools::opt::StructPackingPass::getPackedSize(StructPackingPass *this,Type *type)

{
  bool bVar1;
  Kind KVar2;
  int iVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
  *this_00;
  reference ppTVar6;
  uint *puVar7;
  undefined4 extraout_var_01;
  Type *pTVar8;
  Vector *this_02;
  undefined4 extraout_var_03;
  Vector *vectorType;
  Vector *matrixSubType;
  Matrix *matrixType;
  uint32_t size_2;
  uint32_t baseAlignment;
  uint32_t alignment;
  uint32_t packedAlignment;
  Type *memberType;
  const_iterator __end3;
  const_iterator __begin3;
  vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
  *__range3;
  uint32_t padAlignment;
  uint32_t size_1;
  Type *arraySubType;
  Array *pAStack_28;
  uint32_t size;
  Array *arrayType;
  Type *type_local;
  StructPackingPass *this_local;
  Matrix *this_01;
  undefined4 extraout_var_02;
  
  arrayType = (Array *)type;
  type_local = (Type *)this;
  KVar2 = analysis::Type::kind(type);
  if (KVar2 == kArray) {
    iVar3 = (*(arrayType->super_Type)._vptr_Type[0x18])();
    pAStack_28 = (Array *)CONCAT44(extraout_var,iVar3);
    if (pAStack_28 == (Array *)0x0) {
      __assert_fail("0 && \"Unrecognized type to get packed size\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/struct_packing_pass.cpp"
                    ,300,
                    "uint32_t spvtools::opt::StructPackingPass::getPackedSize(const analysis::Type &) const"
                   );
    }
    uVar4 = getPackedArrayStride(this,pAStack_28);
    uVar5 = getArrayLength(this,pAStack_28);
    arraySubType._4_4_ = uVar4 * uVar5;
    _padAlignment = analysis::Array::element_type(pAStack_28);
    bVar1 = isPackingHlsl(this->packingRules_);
    if ((bVar1) && (KVar2 = analysis::Type::kind(_padAlignment), KVar2 != kStruct)) {
      uVar4 = getScalarElementCount(_padAlignment);
      uVar5 = getPackedBaseSize(_padAlignment);
      arraySubType._4_4_ = arraySubType._4_4_ - (4 - uVar4) * uVar5;
    }
    this_local._4_4_ = arraySubType._4_4_;
  }
  else if (KVar2 == kStruct) {
    __range3._4_4_ = 0;
    __range3._0_4_ = 1;
    iVar3 = (*(arrayType->super_Type)._vptr_Type[0x1e])();
    this_00 = analysis::Struct::element_types((Struct *)CONCAT44(extraout_var_00,iVar3));
    __end3 = std::
             vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
             ::begin(this_00);
    memberType = (Type *)std::
                         vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                         ::end(this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_spvtools::opt::analysis::Type_*const_*,_std::vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>_>
                                       *)&memberType), bVar1) {
      ppTVar6 = __gnu_cxx::
                __normal_iterator<const_spvtools::opt::analysis::Type_*const_*,_std::vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>_>
                ::operator*(&__end3);
      _alignment = *ppTVar6;
      baseAlignment = getPackedAlignment(this,_alignment);
      puVar7 = std::max<unsigned_int>(&baseAlignment,(uint *)&__range3);
      uVar4 = *puVar7;
      __range3._0_4_ = getPadAlignment(_alignment,baseAlignment);
      __range3._4_4_ = alignPow2(__range3._4_4_,uVar4);
      uVar4 = getPackedSize(this,_alignment);
      __range3._4_4_ = uVar4 + __range3._4_4_;
      __gnu_cxx::
      __normal_iterator<const_spvtools::opt::analysis::Type_*const_*,_std::vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>_>
      ::operator++(&__end3);
    }
    this_local._4_4_ = __range3._4_4_;
  }
  else {
    matrixType._0_4_ = getPackedBaseSize(&arrayType->super_Type);
    bVar1 = isPackingScalar(this->packingRules_);
    if (bVar1) {
      uVar4 = getScalarElementCount(&arrayType->super_Type);
      this_local._4_4_ = uVar4 * (uint32_t)matrixType;
    }
    else {
      iVar3 = (*(arrayType->super_Type)._vptr_Type[0x10])();
      this_01 = (Matrix *)CONCAT44(extraout_var_01,iVar3);
      if (this_01 == (Matrix *)0x0) {
        iVar3 = (*(arrayType->super_Type)._vptr_Type[0xe])();
        if ((Vector *)CONCAT44(extraout_var_03,iVar3) != (Vector *)0x0) {
          uVar4 = analysis::Vector::element_count((Vector *)CONCAT44(extraout_var_03,iVar3));
          matrixType._0_4_ = uVar4 * (uint32_t)matrixType;
        }
      }
      else {
        pTVar8 = analysis::Matrix::element_type(this_01);
        iVar3 = (*pTVar8->_vptr_Type[0xe])();
        this_02 = (Vector *)CONCAT44(extraout_var_02,iVar3);
        if (this_02 == (Vector *)0x0) {
          __assert_fail("matrixSubType != nullptr && \"Matrix sub-type is expected to be a vector type\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/struct_packing_pass.cpp"
                        ,0x115,
                        "uint32_t spvtools::opt::StructPackingPass::getPackedSize(const analysis::Type &) const"
                       );
        }
        bVar1 = isPackingVec4Padded(this->packingRules_);
        if ((bVar1) || (uVar4 = analysis::Matrix::element_count(this_01), uVar4 == 3)) {
          uVar4 = analysis::Vector::element_count(this_02);
          matrixType._0_4_ = uVar4 * (uint32_t)matrixType * 4;
        }
        else {
          uVar4 = analysis::Vector::element_count(this_02);
          uVar5 = analysis::Matrix::element_count(this_01);
          matrixType._0_4_ = uVar4 * (uint32_t)matrixType * uVar5;
        }
        bVar1 = isPackingHlsl(this->packingRules_);
        if (bVar1) {
          uVar4 = analysis::Vector::element_count(this_02);
          uVar5 = getPackedBaseSize((Type *)this_02);
          matrixType._0_4_ = (uint32_t)matrixType - (4 - uVar4) * uVar5;
        }
      }
      this_local._4_4_ = (uint32_t)matrixType;
    }
  }
  return this_local._4_4_;
}

Assistant:

uint32_t StructPackingPass::getPackedSize(const analysis::Type& type) const {
  switch (type.kind()) {
    case analysis::Type::kArray: {
      if (const analysis::Array* arrayType = type.AsArray()) {
        uint32_t size =
            getPackedArrayStride(*arrayType) * getArrayLength(*arrayType);

        // For arrays of vector and matrices in HLSL, the last element has a
        // size depending on its vector/matrix size to allow packing other
        // vectors in the last element.
        const analysis::Type* arraySubType = arrayType->element_type();
        if (isPackingHlsl(packingRules_) &&
            arraySubType->kind() != analysis::Type::kStruct) {
          size -= (4 - getScalarElementCount(*arraySubType)) *
                  getPackedBaseSize(*arraySubType);
        }
        return size;
      }
      break;
    }
    case analysis::Type::kStruct: {
      uint32_t size = 0;
      uint32_t padAlignment = 1;
      for (const analysis::Type* memberType :
           type.AsStruct()->element_types()) {
        const uint32_t packedAlignment = getPackedAlignment(*memberType);
        const uint32_t alignment =
            std::max<uint32_t>(packedAlignment, padAlignment);
        padAlignment = getPadAlignment(*memberType, packedAlignment);
        size = alignPow2(size, alignment);
        size += getPackedSize(*memberType);
      }
      return size;
    }
    default: {
      const uint32_t baseAlignment = getPackedBaseSize(type);
      if (isPackingScalar(packingRules_)) {
        return getScalarElementCount(type) * baseAlignment;
      } else {
        uint32_t size = 0;
        if (const analysis::Matrix* matrixType = type.AsMatrix()) {
          const analysis::Vector* matrixSubType =
              matrixType->element_type()->AsVector();
          assert(matrixSubType != nullptr &&
                 "Matrix sub-type is expected to be a vector type");
          if (isPackingVec4Padded(packingRules_) ||
              matrixType->element_count() == 3)
            size = matrixSubType->element_count() * baseAlignment * 4;
          else
            size = matrixSubType->element_count() * baseAlignment *
                   matrixType->element_count();

          // For matrices in HLSL, the last element has a size depending on its
          // vector size to allow packing other vectors in the last element.
          if (isPackingHlsl(packingRules_)) {
            size -= (4 - matrixSubType->element_count()) *
                    getPackedBaseSize(*matrixSubType);
          }
        } else if (const analysis::Vector* vectorType = type.AsVector()) {
          size = vectorType->element_count() * baseAlignment;
        } else {
          size = baseAlignment;
        }
        return size;
      }
    }
  }
  assert(0 && "Unrecognized type to get packed size");
  return 0;
}